

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O0

void Curl_flush_cookies(Curl_easy *data,_Bool cleanup)

{
  char *pcVar1;
  CURLcode error;
  char *pcVar2;
  CURLcode res;
  _Bool cleanup_local;
  Curl_easy *data_local;
  
  if ((data->set).str[0x1b] == (char *)0x0) {
    Curl_share_lock(data,CURL_LOCK_DATA_COOKIE,CURL_LOCK_ACCESS_SINGLE);
  }
  else {
    Curl_share_lock(data,CURL_LOCK_DATA_COOKIE,CURL_LOCK_ACCESS_SINGLE);
    error = cookie_output(data,data->cookies,(data->set).str[0x1b]);
    if ((((error != CURLE_OK) && (data != (Curl_easy *)0x0)) &&
        ((*(ulong *)&(data->set).field_0x8ca >> 0x1c & 1) != 0)) &&
       (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)))) {
      pcVar1 = (data->set).str[0x1b];
      pcVar2 = curl_easy_strerror(error);
      Curl_infof(data,"WARNING: failed to save cookies in %s: %s",pcVar1,pcVar2);
    }
  }
  if ((cleanup) && ((data->share == (Curl_share *)0x0 || (data->cookies != data->share->cookies))))
  {
    Curl_cookie_cleanup(data->cookies);
    data->cookies = (CookieInfo *)0x0;
  }
  Curl_share_unlock(data,CURL_LOCK_DATA_COOKIE);
  return;
}

Assistant:

void Curl_flush_cookies(struct Curl_easy *data, bool cleanup)
{
  CURLcode res;

  if(data->set.str[STRING_COOKIEJAR]) {
    Curl_share_lock(data, CURL_LOCK_DATA_COOKIE, CURL_LOCK_ACCESS_SINGLE);

    /* if we have a destination file for all the cookies to get dumped to */
    res = cookie_output(data, data->cookies, data->set.str[STRING_COOKIEJAR]);
    if(res)
      infof(data, "WARNING: failed to save cookies in %s: %s",
            data->set.str[STRING_COOKIEJAR], curl_easy_strerror(res));
  }
  else {
    Curl_share_lock(data, CURL_LOCK_DATA_COOKIE, CURL_LOCK_ACCESS_SINGLE);
  }

  if(cleanup && (!data->share || (data->cookies != data->share->cookies))) {
    Curl_cookie_cleanup(data->cookies);
    data->cookies = NULL;
  }
  Curl_share_unlock(data, CURL_LOCK_DATA_COOKIE);
}